

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DynamicTypeHandler::SetPrototype
          (DynamicTypeHandler *this,DynamicObject *instance,RecyclableObject *newPrototype)

{
  DynamicType *this_00;
  RecyclableObject *newPrototype_local;
  DynamicObject *instance_local;
  DynamicTypeHandler *this_local;
  
  ResetTypeHandler(this,instance);
  this_00 = DynamicObject::GetDynamicType(instance);
  DynamicType::SetPrototype(this_00,newPrototype);
  return;
}

Assistant:

void DynamicTypeHandler::SetPrototype(DynamicObject* instance, RecyclableObject* newPrototype)
    {
        // Force a type transition on the instance to invalidate its inline caches
        DynamicTypeHandler::ResetTypeHandler(instance);

        // Put new prototype in place
        instance->GetDynamicType()->SetPrototype(newPrototype);
    }